

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

void __thiscall
icu_63::anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
          (FCDUTF16NFDIterator *this,Normalizer2Impl *nfcImpl,UChar *text,UChar *textLimit)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  int iVar3;
  char16_t *pcVar4;
  int32_t length;
  uint uVar5;
  UErrorCode errorCode;
  ReorderingBuffer r_buffer;
  UErrorCode local_74;
  ReorderingBuffer local_70;
  
  (this->super_UTF16NFDIterator).super_NFDIterator.index = -1;
  (this->super_UTF16NFDIterator).super_NFDIterator.length = 0;
  (this->super_UTF16NFDIterator).s = (UChar *)0x0;
  (this->super_UTF16NFDIterator).limit = (UChar *)0x0;
  (this->super_UTF16NFDIterator).super_NFDIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__FCDUTF16NFDIterator_003b19a0;
  this_00 = &this->str;
  (this->str).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003be258;
  (this->str).fUnion.fStackFields.fLengthAndFlags = 2;
  local_74 = U_ZERO_ERROR;
  pcVar4 = Normalizer2Impl::makeFCD(nfcImpl,text,textLimit,(ReorderingBuffer *)0x0,&local_74);
  if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((pcVar4 == textLimit) || ((textLimit == (UChar *)0x0 && (*pcVar4 == L'\0')))) {
      (this->super_UTF16NFDIterator).s = text;
    }
    else {
      UnicodeString::unBogus(this_00);
      sVar1 = (this->str).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length = (this->str).fUnion.fFields.fLength;
      }
      else {
        length = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace
                (this_00,0,length,text,0,(int32_t)((ulong)((long)pcVar4 - (long)text) >> 1));
      local_70.start = (UChar *)0x0;
      local_70.reorderStart._0_5_ = 0;
      local_70.reorderStart._5_3_ = 0;
      local_70.limit._0_5_ = 0;
      local_70._37_8_ = 0;
      sVar1 = (this->str).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar5 = (this->str).fUnion.fFields.fLength;
      }
      else {
        uVar5 = (int)sVar1 >> 5;
      }
      local_70.impl = nfcImpl;
      local_70.str = this_00;
      iVar3 = ReorderingBuffer::init(&local_70,(EVP_PKEY_CTX *)(ulong)uVar5);
      if ((char)iVar3 != '\0') {
        Normalizer2Impl::makeFCD(nfcImpl,pcVar4,textLimit,&local_70,&local_74);
      }
      ReorderingBuffer::~ReorderingBuffer(&local_70);
      if (U_ZERO_ERROR < local_74) {
        return;
      }
      uVar2 = (this->str).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar2 & 0x11) == 0) {
        if ((uVar2 & 2) == 0) {
          pcVar4 = (this->str).fUnion.fFields.fArray;
        }
        else {
          pcVar4 = (this->str).fUnion.fStackFields.fBuffer;
        }
      }
      else {
        pcVar4 = (char16_t *)0x0;
      }
      (this->super_UTF16NFDIterator).s = pcVar4;
      if ((short)uVar2 < 0) {
        iVar3 = (this->str).fUnion.fFields.fLength;
      }
      else {
        iVar3 = (int)(short)uVar2 >> 5;
      }
      pcVar4 = pcVar4 + iVar3;
    }
    (this->super_UTF16NFDIterator).limit = pcVar4;
  }
  return;
}

Assistant:

FCDUTF16NFDIterator(const Normalizer2Impl &nfcImpl, const UChar *text, const UChar *textLimit)
            : UTF16NFDIterator(NULL, NULL) {
        UErrorCode errorCode = U_ZERO_ERROR;
        const UChar *spanLimit = nfcImpl.makeFCD(text, textLimit, NULL, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(spanLimit == textLimit || (textLimit == NULL && *spanLimit == 0)) {
            s = text;
            limit = spanLimit;
        } else {
            str.setTo(text, (int32_t)(spanLimit - text));
            {
                ReorderingBuffer r_buffer(nfcImpl, str);
                if(r_buffer.init(str.length(), errorCode)) {
                    nfcImpl.makeFCD(spanLimit, textLimit, &r_buffer, errorCode);
                }
            }
            if(U_SUCCESS(errorCode)) {
                s = str.getBuffer();
                limit = s + str.length();
            }
        }
    }